

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeFaceNormals
          (EmbeddedGeometryInterface *this)

{
  SurfaceMesh *pSVar1;
  size_t sVar2;
  pointer puVar3;
  Vector3 *pVVar4;
  unsigned_long uVar5;
  Vector3 *pVVar6;
  pointer puVar7;
  pointer puVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  size_t sVar17;
  bool bVar18;
  size_t i_1;
  unsigned_long uVar19;
  size_t i_2;
  size_t i;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> local_78;
  
  if ((this->vertexPositionsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexPositionsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexPositionsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::MeshData
            (&local_78,
             (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::operator=
            (&this->faceNormals,&local_78);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::~MeshData(&local_78);
  pSVar1 = (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
           super_BaseGeometryInterface.mesh;
  sVar2 = pSVar1->nFacesFillCount;
  if ((sVar2 == 0) ||
     (puVar3 = (pSVar1->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff)) {
    sVar17 = 0;
  }
  else {
    sVar17 = 0;
    do {
      if (sVar2 - 1 == sVar17) {
        return;
      }
      lVar16 = sVar17 + 1;
      sVar17 = sVar17 + 1;
    } while (puVar3[lVar16] == 0xffffffffffffffff);
  }
  if (sVar17 != sVar2) {
    pVVar4 = (this->faceNormals).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    puVar3 = (pSVar1->fHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar5 = puVar3[sVar17];
      pVVar6 = (this->vertexPositions).data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      auVar22 = ZEXT864(0) << 0x40;
      auVar24 = ZEXT864(0) << 0x40;
      bVar18 = true;
      uVar19 = uVar5;
      do {
        auVar21 = auVar22._0_16_;
        auVar23 = auVar24._0_16_;
        if ((!bVar18) && (uVar19 == uVar5)) break;
        puVar7 = (pSVar1->heVertexArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = (pSVar1->heNextArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = puVar7[uVar19];
        uVar10 = puVar8[uVar19];
        auVar15._0_8_ = pVVar6[uVar9].y;
        auVar15._8_8_ = pVVar6[uVar9].z;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pVVar6[uVar9].x;
        auVar33._8_8_ = pVVar6[uVar9].z;
        auVar33._0_8_ = pVVar6[uVar9].z;
        uVar11 = puVar7[puVar8[uVar10]];
        auVar14._0_8_ = pVVar6[puVar7[uVar10]].y;
        auVar14._8_8_ = pVVar6[puVar7[uVar10]].z;
        bVar18 = false;
        auVar23 = vsubpd_avx(auVar14,auVar15);
        auVar14 = vunpcklpd_avx(auVar33,auVar26);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = pVVar6[uVar11].z;
        auVar21 = vmovhpd_avx(auVar31,pVVar6[uVar11].x);
        auVar14 = vsubpd_avx(auVar21,auVar14);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = pVVar6[puVar7[uVar10]].x - pVVar6[uVar9].x;
        auVar21 = vshufpd_avx(auVar23,auVar29,1);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = pVVar6[uVar11].y - (double)auVar15._0_8_;
        auVar15 = vunpcklpd_avx(auVar30,auVar14);
        auVar32._0_8_ = auVar15._0_8_ * auVar21._0_8_;
        auVar32._8_8_ = auVar15._8_8_ * auVar21._8_8_;
        auVar15 = vfmsub231pd_fma(auVar32,auVar23,auVar14);
        auVar21 = vshufpd_avx(auVar14,auVar14,1);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar21._0_8_ * auVar23._0_8_;
        auVar23 = vfmsub231sd_fma(auVar27,auVar29,auVar30);
        auVar21._0_8_ = auVar22._0_8_ + auVar15._0_8_;
        auVar21._8_8_ = auVar22._8_8_ + auVar15._8_8_;
        auVar22 = ZEXT1664(auVar21);
        dVar12 = auVar24._0_8_ + auVar23._0_8_;
        auVar24 = ZEXT864((ulong)dVar12);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar12;
        bVar20 = puVar8[puVar8[uVar10]] != uVar19;
        uVar19 = uVar10;
      } while (bVar20);
      dVar12 = auVar21._0_8_;
      auVar28._0_8_ = dVar12 * dVar12;
      dVar13 = auVar21._8_8_;
      auVar28._8_8_ = dVar13 * dVar13;
      auVar15 = vshufpd_avx(auVar28,auVar28,1);
      auVar21 = vfmadd231sd_fma(auVar15,auVar21,auVar21);
      auVar21 = vfmadd231sd_fma(auVar21,auVar23,auVar23);
      auVar21 = vsqrtsd_avx(auVar21,auVar21);
      dVar25 = 1.0 / auVar21._0_8_;
      pVVar6 = pVVar4 + sVar17;
      pVVar6->x = dVar12 * dVar25;
      pVVar6->y = dVar13 * dVar25;
      pVVar4[sVar17].z = auVar23._0_8_ * dVar25;
      do {
        if (sVar2 - 1 == sVar17) {
          return;
        }
        lVar16 = sVar17 + 1;
        sVar17 = sVar17 + 1;
      } while (puVar3[lVar16] == 0xffffffffffffffff);
    } while (sVar2 != sVar17);
  }
  return;
}

Assistant:

void EmbeddedGeometryInterface::computeFaceNormals() {
  vertexPositionsQ.ensureHave();

  faceNormals = FaceData<Vector3>(mesh);

  for (Face f : mesh.faces()) {

    // For general polygons, take the sum of the cross products at each corner
    Vector3 normalSum = Vector3::zero();
    for (Halfedge heF : f.adjacentHalfedges()) {

      // Gather vertex positions for next three vertices
      Halfedge he = heF;
      Vector3 pA = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];

      normalSum += cross(pB - pA, pC - pA);

      // In the special case of a triangle, there is no need to to repeat at all three corners; the result will be the
      // same
      if (he.next() == heF) break;
    }

    Vector3 normal = unit(normalSum);
    faceNormals[f] = normal;
  }
}